

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

bool __thiscall Func::IsArrayCheckHoistDisabled(Func *this)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  
  bVar1 = HasProfileInfo(this);
  if (bVar1) {
    this_00 = GetReadOnlyProfileInfo(this);
    bVar1 = IsLoopBody(this);
    bVar1 = JITTimeProfileInfo::IsArrayCheckHoistDisabled(this_00,bVar1);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsArrayCheckHoistDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsArrayCheckHoistDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsArrayCheckHoistDisabled(IsLoopBody())) || m_output.IsArrayCheckHoistDisabled();
}